

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O1

int xz_decomp(xz_statep state)

{
  size_t sVar1;
  size_t sVar2;
  uint8_t *puVar3;
  int iVar4;
  uint err;
  uLong uVar5;
  ulong uVar6;
  char *msg;
  undefined8 uVar7;
  unsigned_long len;
  unsigned_long crc;
  ulong local_40;
  uLong local_38;
  
  sVar1 = (state->strm).avail_out;
  uVar7 = 0;
  do {
    if (((state->strm).avail_in == 0) && (iVar4 = xz_avail(state), iVar4 == -1)) {
      return -1;
    }
    sVar2 = (state->strm).avail_in;
    if (sVar2 == 0) goto LAB_001e84fe;
    if (state->eof != 0) {
      uVar7 = 3;
    }
    if (state->how == 2) {
      (state->zstrm).avail_in = (uInt)sVar2;
      puVar3 = (state->strm).next_out;
      (state->zstrm).next_in = (state->strm).next_in;
      (state->zstrm).avail_out = (uInt)(state->strm).avail_out;
      (state->zstrm).next_out = puVar3;
      err = inflate(&state->zstrm,0);
      if ((err == 2) || (err == 0xfffffffe)) {
        msg = "internal error: inflate stream corrupt";
        err = 0xfffffffe;
        goto LAB_001e857b;
      }
      if (err == 0xfffffffc) {
        err = 5;
      }
      if (err == 0xfffffffd) {
        err = 9;
      }
      (state->strm).avail_in = (ulong)(state->zstrm).avail_in;
      (state->strm).next_in = (state->zstrm).next_in;
      (state->strm).avail_out = (ulong)(state->zstrm).avail_out;
      (state->strm).next_out = (state->zstrm).next_out;
    }
    else {
      err = lzma_code(&state->strm,uVar7);
    }
    if (err == 0xb) {
      msg = "compression error";
      err = 0xb;
      goto LAB_001e857b;
    }
    if (err == 9) {
      msg = "compressed data error";
      goto LAB_001e8564;
    }
    if (err == 5) {
      if (state->msg != (char *)0x0) {
        if (state->err != 5) {
          (*xmlFree)(state->msg);
        }
        state->msg = (char *)0x0;
      }
      state->err = 5;
      state->msg = "out of memory";
      return -1;
    }
    if ((1 < err) && (state->how != 2)) {
      msg = "lzma error";
      goto LAB_001e857b;
    }
    sVar2 = (state->strm).avail_out;
  } while ((err != 1) && (sVar2 != 0));
  uVar6 = sVar1 - sVar2;
  state->have = (uint)uVar6;
  uVar5 = (state->zstrm).adler;
  state->next = (state->strm).next_out + -(uVar6 & 0xffffffff);
  uVar5 = crc32(uVar5);
  (state->zstrm).adler = uVar5;
  if (err != 1) {
    return 0;
  }
  if (state->how == 2) {
    iVar4 = gz_next4(state,&local_38);
    if ((iVar4 == -1) || (iVar4 = gz_next4(state,&local_40), iVar4 == -1)) {
LAB_001e84fe:
      msg = "unexpected end of file";
    }
    else if (local_38 == (state->zstrm).adler) {
      if (local_40 == (uint)(state->zstrm).total_out) {
        (state->strm).next_in = (uint8_t *)0x0;
        (state->strm).avail_in = 0;
        (state->strm).next_out = (uint8_t *)0x0;
        (state->strm).avail_out = 0;
        goto LAB_001e85af;
      }
      msg = "incorrect length check";
    }
    else {
      msg = "incorrect data check";
    }
  }
  else {
    if (((state->strm).avail_in == 0) && (state->eof != 0)) {
LAB_001e85af:
      state->how = 0;
      return 0;
    }
    msg = "trailing garbage";
  }
LAB_001e8564:
  err = 9;
LAB_001e857b:
  xz_error(state,err,msg);
  return -1;
}

Assistant:

static int
xz_decomp(xz_statep state)
{
    int ret;
    unsigned had;
    unsigned long crc, len;
    lzma_stream *strm = &(state->strm);

    lzma_action action = LZMA_RUN;

    /* Avoid unused variable warning if features are disabled. */
    (void) crc;
    (void) len;

    /* fill output buffer up to end of deflate stream */
    had = strm->avail_out;
    do {
        /* get more input for inflate() */
        if (strm->avail_in == 0 && xz_avail(state) == -1)
            return -1;
        if (strm->avail_in == 0) {
            xz_error(state, LZMA_DATA_ERROR, "unexpected end of file");
            return -1;
        }
        if (state->eof)
            action = LZMA_FINISH;

        /* decompress and handle errors */
#ifdef LIBXML_ZLIB_ENABLED
        if (state->how == GZIP) {
            state->zstrm.avail_in = (uInt) state->strm.avail_in;
            state->zstrm.next_in = (Bytef *) state->strm.next_in;
            state->zstrm.avail_out = (uInt) state->strm.avail_out;
            state->zstrm.next_out = (Bytef *) state->strm.next_out;
            ret = inflate(&state->zstrm, Z_NO_FLUSH);
            if (ret == Z_STREAM_ERROR || ret == Z_NEED_DICT) {
                xz_error(state, Z_STREAM_ERROR,
                         "internal error: inflate stream corrupt");
                return -1;
            }
            /*
             * FIXME: Remapping a couple of error codes and falling through
             * to the LZMA error handling looks fragile.
             */
            if (ret == Z_MEM_ERROR)
                ret = LZMA_MEM_ERROR;
            if (ret == Z_DATA_ERROR)
                ret = LZMA_DATA_ERROR;
            if (ret == Z_STREAM_END)
                ret = LZMA_STREAM_END;
            state->strm.avail_in = state->zstrm.avail_in;
            state->strm.next_in = state->zstrm.next_in;
            state->strm.avail_out = state->zstrm.avail_out;
            state->strm.next_out = state->zstrm.next_out;
        } else                  /* state->how == LZMA */
#endif
            ret = lzma_code(strm, action);
        if (ret == LZMA_MEM_ERROR) {
            xz_error(state, LZMA_MEM_ERROR, "out of memory");
            return -1;
        }
        if (ret == LZMA_DATA_ERROR) {
            xz_error(state, LZMA_DATA_ERROR, "compressed data error");
            return -1;
        }
        if (ret == LZMA_PROG_ERROR) {
            xz_error(state, LZMA_PROG_ERROR, "compression error");
            return -1;
        }
        if ((state->how != GZIP) &&
            (ret != LZMA_OK) && (ret != LZMA_STREAM_END)) {
            xz_error(state, ret, "lzma error");
            return -1;
        }
    } while (strm->avail_out && ret != LZMA_STREAM_END);

    /* update available output and crc check value */
    state->have = had - strm->avail_out;
    state->next = strm->next_out - state->have;
#ifdef LIBXML_ZLIB_ENABLED
    state->zstrm.adler =
        crc32(state->zstrm.adler, state->next, state->have);
#endif

    if (ret == LZMA_STREAM_END) {
#ifdef LIBXML_ZLIB_ENABLED
        if (state->how == GZIP) {
            if (gz_next4(state, &crc) == -1 || gz_next4(state, &len) == -1) {
                xz_error(state, LZMA_DATA_ERROR, "unexpected end of file");
                return -1;
            }
            if (crc != state->zstrm.adler) {
                xz_error(state, LZMA_DATA_ERROR, "incorrect data check");
                return -1;
            }
            if (len != (state->zstrm.total_out & 0xffffffffL)) {
                xz_error(state, LZMA_DATA_ERROR, "incorrect length check");
                return -1;
            }
            state->strm.avail_in = 0;
            state->strm.next_in = NULL;
            state->strm.avail_out = 0;
            state->strm.next_out = NULL;
        } else
#endif
        if (strm->avail_in != 0 || !state->eof) {
            xz_error(state, LZMA_DATA_ERROR, "trailing garbage");
            return -1;
        }
        state->how = LOOK;      /* ready for next stream, once have is 0 (leave
                                 * state->direct unchanged to remember how) */
    }

    /* good decompression */
    return 0;
}